

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void array_container_add_from_range(array_container_t *arr,uint32_t min,uint32_t max,uint16_t step)

{
  long lVar1;
  uint32_t value;
  int iVar2;
  
  if (min < max) {
    iVar2 = arr->cardinality;
    do {
      if (iVar2 == arr->capacity) {
        array_container_grow(arr,iVar2 + 1,true);
        iVar2 = arr->cardinality;
      }
      lVar1 = (long)iVar2;
      iVar2 = iVar2 + 1;
      arr->cardinality = iVar2;
      arr->array[lVar1] = (uint16_t)min;
      min = min + step;
    } while (min < max);
  }
  return;
}

Assistant:

void array_container_add_from_range(array_container_t *arr, uint32_t min,
                                    uint32_t max, uint16_t step) {
    for (uint32_t value = min; value < max; value += step) {
        array_container_append(arr, value);
    }
}